

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * max_expand(MatchState *ms,char *s,char *p,char *ep)

{
  int iVar1;
  char *pcVar2;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  char *unaff_retaddr;
  char *in_stack_00000008;
  char *res;
  ptrdiff_t i;
  uint7 in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    bVar3 = false;
    if ((ulong)(in_RSI + lVar4) < *(ulong *)(in_RDI + 8)) {
      iVar1 = singlematch((int)lVar4,in_stack_ffffffffffffffc8,
                          (char *)(ulong)in_stack_ffffffffffffffc0);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    lVar4 = lVar4 + 1;
  }
  while( true ) {
    if (lVar4 < 0) {
      return (char *)0x0;
    }
    pcVar2 = match((MatchState *)res,in_stack_00000008,unaff_retaddr);
    if (pcVar2 != (char *)0x0) break;
    lVar4 = lVar4 + -1;
  }
  return pcVar2;
}

Assistant:

static const char *max_expand(MatchState *ms, const char *s,
			      const char *p, const char *ep)
{
  ptrdiff_t i = 0;  /* counts maximum expand for item */
  while ((s+i)<ms->src_end && singlematch(uchar(*(s+i)), p, ep))
    i++;
  /* keeps trying to match with the maximum repetitions */
  while (i>=0) {
    const char *res = match(ms, (s+i), ep+1);
    if (res) return res;
    i--;  /* else didn't match; reduce 1 repetition to try again */
  }
  return NULL;
}